

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_smart_pointers.cpp
# Opt level: O0

void use_smart_pointers(void)

{
  Report *pRVar1;
  element_type *this;
  element_type *this_00;
  pointer this_01;
  ostream *poVar2;
  undefined1 local_e8 [8];
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ps_3;
  undefined1 local_d0 [8];
  string s;
  string local_a8;
  unique_ptr<L16_1::Report,_std::default_delete<L16_1::Report>_> local_88;
  unique_ptr<L16_1::Report,_std::default_delete<L16_1::Report>_> ps_2;
  string local_78;
  undefined1 local_58 [8];
  shared_ptr<L16_1::Report> ps_1;
  allocator local_31;
  string local_30;
  auto_ptr<L16_1::Report> local_10;
  auto_ptr<L16_1::Report> ps;
  
  pRVar1 = (Report *)operator_new(0x20);
  ps_1.super___shared_ptr<L16_1::Report,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"I\'m using auto pointer!",&local_31);
  L16_1::Report::Report(pRVar1,&local_30);
  ps_1.super___shared_ptr<L16_1::Report,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = 0;
  std::auto_ptr<L16_1::Report>::auto_ptr(&local_10,pRVar1);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  this = std::auto_ptr<L16_1::Report>::operator->(&local_10);
  L16_1::Report::comment(this);
  std::auto_ptr<L16_1::Report>::~auto_ptr(&local_10);
  pRVar1 = (Report *)operator_new(0x20);
  ps_2._M_t.super___uniq_ptr_impl<L16_1::Report,_std::default_delete<L16_1::Report>_>._M_t.
  super__Tuple_impl<0UL,_L16_1::Report_*,_std::default_delete<L16_1::Report>_>.
  super__Head_base<0UL,_L16_1::Report_*,_false>._M_head_impl._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_78,"I\'m using shared pointer!",
             (allocator *)
             ((long)&ps_2._M_t.
                     super___uniq_ptr_impl<L16_1::Report,_std::default_delete<L16_1::Report>_>._M_t.
                     super__Tuple_impl<0UL,_L16_1::Report_*,_std::default_delete<L16_1::Report>_>.
                     super__Head_base<0UL,_L16_1::Report_*,_false>._M_head_impl + 7));
  L16_1::Report::Report(pRVar1,&local_78);
  ps_2._M_t.super___uniq_ptr_impl<L16_1::Report,_std::default_delete<L16_1::Report>_>._M_t.
  super__Tuple_impl<0UL,_L16_1::Report_*,_std::default_delete<L16_1::Report>_>.
  super__Head_base<0UL,_L16_1::Report_*,_false>._M_head_impl._6_1_ = 0;
  std::shared_ptr<L16_1::Report>::shared_ptr<L16_1::Report,void>
            ((shared_ptr<L16_1::Report> *)local_58,pRVar1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ps_2._M_t.
                     super___uniq_ptr_impl<L16_1::Report,_std::default_delete<L16_1::Report>_>._M_t.
                     super__Tuple_impl<0UL,_L16_1::Report_*,_std::default_delete<L16_1::Report>_>.
                     super__Head_base<0UL,_L16_1::Report_*,_false>._M_head_impl + 7));
  this_00 = std::__shared_ptr_access<L16_1::Report,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<L16_1::Report,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_58);
  L16_1::Report::comment(this_00);
  std::shared_ptr<L16_1::Report>::~shared_ptr((shared_ptr<L16_1::Report> *)local_58);
  pRVar1 = (Report *)operator_new(0x20);
  s.field_2._M_local_buf[0xe] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a8,"I\'m using unique pointer!",
             (allocator *)(s.field_2._M_local_buf + 0xf));
  L16_1::Report::Report(pRVar1,&local_a8);
  s.field_2._M_local_buf[0xe] = '\0';
  std::unique_ptr<L16_1::Report,std::default_delete<L16_1::Report>>::
  unique_ptr<std::default_delete<L16_1::Report>,void>
            ((unique_ptr<L16_1::Report,std::default_delete<L16_1::Report>> *)&local_88,pRVar1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)(s.field_2._M_local_buf + 0xf));
  this_01 = std::unique_ptr<L16_1::Report,_std::default_delete<L16_1::Report>_>::operator->
                      (&local_88);
  L16_1::Report::comment(this_01);
  std::unique_ptr<L16_1::Report,_std::default_delete<L16_1::Report>_>::~unique_ptr(&local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_d0,"Just curious about c++...",
             (allocator *)
             ((long)&ps_3.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ps_3.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::shared_ptr<std::__cxx11::string>::shared_ptr<std::__cxx11::string,void>
            ((shared_ptr<std::__cxx11::string> *)local_e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  poVar2 = std::operator<<((ostream *)&std::cout,"s: ");
  std::operator<<(poVar2,(string *)local_d0);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_e8);
  std::__cxx11::string::~string((string *)local_d0);
  return;
}

Assistant:

void use_smart_pointers() {
    using namespace L16_1;
    using namespace std;

    {
        auto_ptr<Report> ps(new Report("I'm using auto pointer!"));
        //  ps is actually an object. it override operator->
        ps->comment();
    }

    {
        shared_ptr<Report> ps(new Report("I'm using shared pointer!"));
        ps->comment();
    }

    {
        unique_ptr<Report> ps(new Report("I'm using unique pointer!"));
        //  same as above...
        ps->comment();
    }

    {
        //  this is auto variable, it is on stack, NOT heap
        string s("Just curious about c++...");

        //  use address on heap, when destruct, will cause 'delete xxx', that is actually an error
        shared_ptr<string> ps(&s);

        cout << "s: " << s;
    }
}